

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nested.cpp
# Opt level: O3

tuple<NS_*,_NS_*> test_graphs::simple(void)

{
  NS *graph;
  NS *graph_00;
  N *this;
  N *this_00;
  undefined8 *puVar1;
  N *this_01;
  N *this_02;
  N *this_03;
  _Head_base<0UL,_NS_*,_false> extraout_RDX;
  _Tuple_impl<1UL,_NS_*> in_RDI;
  tuple<NS_*,_NS_*> tVar2;
  N *local_38;
  
  graph = (NS *)operator_new(0x18);
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  graph_00 = (NS *)operator_new(0x18);
  (graph_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (graph_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (graph_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this,"has nested");
  this_00 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this_00,"element");
  puVar1 = (undefined8 *)N::operator_new(0x78,graph);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = graph_00;
  *(undefined1 *)(puVar1 + 0xe) = 3;
  this_01 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this_01,"p");
  this_02 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this_02,"a");
  this_03 = (N *)N::operator_new(0x78,graph_00);
  N::N<char_const*>(this_03,"b");
  local_38 = (N *)puVar1;
  N::connect(this_00,(int)this,(sockaddr *)&local_38,1);
  local_38 = this_03;
  N::connect(this_02,(int)this_01,(sockaddr *)&local_38,1);
  *(NS **)in_RDI.super__Head_base<1UL,_NS_*,_false>._M_head_impl = graph_00;
  *(NS **)((long)in_RDI.super__Head_base<1UL,_NS_*,_false>._M_head_impl + 8) = graph;
  tVar2.super__Tuple_impl<0UL,_NS_*,_NS_*>.super__Head_base<0UL,_NS_*,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  tVar2.super__Tuple_impl<0UL,_NS_*,_NS_*>.super__Tuple_impl<1UL,_NS_*>.
  super__Head_base<1UL,_NS_*,_false>._M_head_impl =
       in_RDI.super__Head_base<1UL,_NS_*,_false>._M_head_impl;
  return (tuple<NS_*,_NS_*>)tVar2.super__Tuple_impl<0UL,_NS_*,_NS_*>;
}

Assistant:

std::tuple<NS*, NS*> simple() {
        auto g = new NS();
        auto sub_g = new NS();
        auto has = new(g) N("has nested"), el = new(g) N("element"), n = new(g) N(sub_g);
        auto p = new(g) N("p"), a = new(g) N("a"), b = new(sub_g) N("b");

        el->connect(has, {n});
        a->connect(p, {b});

        return {g, sub_g};
    }